

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O3

void __thiscall
gch::detail::small_vector_base<std::allocator<std::pair<std::pair<int,int>,double>>,8u>::
small_vector_base<8u>
          (small_vector_base<std::allocator<std::pair<std::pair<int,int>,double>>,8u> *this,
          long *param_2)

{
  small_vector_base<std::allocator<std::pair<std::pair<int,int>,double>>,8u> *psVar1;
  undefined8 *puVar2;
  ulong __n;
  long lVar3;
  undefined8 uVar4;
  pair<std::pair<int,_int>,_double> *ppVar5;
  long lVar6;
  long lVar7;
  
  __n = param_2[2];
  if (__n < 9) {
    *(undefined8 *)(this + 8) = 8;
    psVar1 = this + 0x18;
    *(small_vector_base<std::allocator<std::pair<std::pair<int,int>,double>>,8u> **)this = psVar1;
    if (__n != 0) {
      lVar3 = *param_2;
      lVar6 = 0;
      do {
        uVar4 = ((undefined8 *)(lVar3 + lVar6))[1];
        *(undefined8 *)(psVar1 + lVar6) = *(undefined8 *)(lVar3 + lVar6);
        *(undefined8 *)(psVar1 + lVar6 + 8) = uVar4;
        lVar6 = lVar6 + 0x10;
      } while (__n << 4 != lVar6);
    }
  }
  else {
    ppVar5 = __gnu_cxx::new_allocator<std::pair<std::pair<int,_int>,_double>_>::allocate
                       ((new_allocator<std::pair<std::pair<int,_int>,_double>_> *)this,__n,
                        (void *)(param_2[1] * 0x10 + *param_2));
    *(pair<std::pair<int,_int>,_double> **)this = ppVar5;
    lVar3 = param_2[2];
    *(long *)(this + 8) = lVar3;
    if (lVar3 != 0) {
      lVar6 = *param_2;
      lVar7 = 0;
      do {
        uVar4 = ((undefined8 *)(lVar6 + lVar7))[1];
        puVar2 = (undefined8 *)((long)&(ppVar5->first).first + lVar7);
        *puVar2 = *(undefined8 *)(lVar6 + lVar7);
        puVar2[1] = uVar4;
        lVar7 = lVar7 + 0x10;
      } while (lVar3 << 4 != lVar7);
    }
  }
  *(long *)(this + 0x10) = param_2[2];
  return;
}

Assistant:

GCH_CPP20_CONSTEXPR
      small_vector_base (bypass_tag,
                         const small_vector_base<Allocator, I>& other,
                         const MaybeAlloc&... alloc)
        : alloc_interface (other, alloc...)
      {
        if (InlineCapacity < other.get_size ())
        {
          set_data_ptr (unchecked_allocate (other.get_size (), other.allocation_end_ptr ()));
          set_capacity (other.get_size ());

          GCH_TRY
          {
            uninitialized_copy (other.begin_ptr (), other.end_ptr (), data_ptr ());
          }
          GCH_CATCH (...)
          {
            deallocate (data_ptr (), get_capacity ());
            GCH_THROW;
          }
        }